

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall slang::syntax::RsRuleSyntax::getChild(RsRuleSyntax *this,size_t index)

{
  long in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  TokenOrSyntax *in_stack_ffffffffffffffc0;
  nullptr_t in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 1) {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 2) {
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax RsRuleSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return randJoin;
        case 1: return &prods;
        case 2: return weightClause;
        default: return nullptr;
    }
}